

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O0

void __thiscall ent::base::base(base *this,uint32_t id,ByteVector *data)

{
  FILE *__stream;
  char *__buf;
  ByteVector *data_local;
  uint32_t id_local;
  base *this_local;
  
  MemoryReader::MemoryReader(&this->super_MemoryReader);
  (this->super_MemoryReader).super_ReadWriter._vptr_ReadWriter = (_func_int **)&PTR__base_00189548;
  this->_id = id;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->_data,data);
  __stream = (FILE *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front(&this->_data)
  ;
  __buf = (char *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_data);
  MemoryReader::setbuf(&this->super_MemoryReader,__stream,__buf);
  return;
}

Assistant:

base(uint32_t id, const ByteVector& data)
        : _id(id), _data(data)
    {
        setbuf(&_data.front(), _data.size());
    }